

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chibicc_parse.c
# Opt level: O3

C_Token * attribute_list(C_Parser *parser,C_Token *tok,C_Type *ty)

{
  _Bool _Var1;
  C_Node *node;
  int64_t iVar2;
  C_Token *local_38;
  
  local_38 = tok;
  _Var1 = C_consume(&local_38,tok,"__attribute__");
  if (_Var1) {
    do {
      local_38 = C_skip(parser,local_38,"(");
      local_38 = C_skip(parser,local_38,"(");
      _Var1 = C_consume(&local_38,local_38,")");
      if (!_Var1) {
        while( true ) {
          _Var1 = C_consume(&local_38,local_38,"packed");
          if (_Var1) {
            ty->is_packed = true;
          }
          else {
            _Var1 = C_consume(&local_38,local_38,"aligned");
            if (!_Var1) {
              C_error_tok(parser,local_38,"unknown attribute");
            }
            local_38 = C_skip(parser,local_38,"(");
            node = conditional(parser,&local_38,local_38);
            iVar2 = eval2(parser,node,(char ***)0x0);
            ty->align = (int)iVar2;
            local_38 = C_skip(parser,local_38,")");
          }
          _Var1 = C_consume(&local_38,local_38,")");
          if (_Var1) break;
          local_38 = C_skip(parser,local_38,",");
        }
      }
      local_38 = C_skip(parser,local_38,")");
      _Var1 = C_consume(&local_38,local_38,"__attribute__");
    } while (_Var1);
  }
  return local_38;
}

Assistant:

static C_Token *attribute_list(C_Parser *parser, C_Token *tok, C_Type *ty) {
  while (C_consume(&tok, tok, "__attribute__")) {
    tok = C_skip(parser, tok, "(");
    tok = C_skip(parser, tok, "(");

    bool first = true;

    while (!C_consume(&tok, tok, ")")) {
      if (!first)
        tok = C_skip(parser, tok, ",");
      first = false;

      if (C_consume(&tok, tok, "packed")) {
        ty->is_packed = true;
        continue;
      }

      if (C_consume(&tok, tok, "aligned")) {
        tok = C_skip(parser, tok, "(");
        ty->align = C_const_expr(parser, &tok, tok);
        tok = C_skip(parser, tok, ")");
        continue;
      }

      C_error_tok(parser, tok, "unknown attribute");
    }

    tok = C_skip(parser, tok, ")");
  }

  return tok;
}